

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O1

void Assimp::IFC::ProcessSweptAreaSolid
               (IfcSweptAreaSolid *swept,TempMesh *meshout,ConversionData *conv)

{
  _func_int **pp_Var1;
  IfcExtrudedAreaSolid *solid;
  IfcRevolvedAreaSolid *solid_00;
  long *plVar2;
  size_type *psVar3;
  _func_int *p_Var4;
  allocator<char> local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0 [376];
  
  pp_Var1 = (swept->super_IfcSolidModel).super_IfcGeometricRepresentationItem.
            super_IfcRepresentationItem.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
            _vptr_ObjectHelper;
  p_Var4 = (_func_int *)
           ((long)&(swept->super_IfcSolidModel).super_IfcGeometricRepresentationItem.
                   super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper + (long)pp_Var1[-3]);
  solid = (IfcExtrudedAreaSolid *)
          __dynamic_cast(p_Var4,&STEP::Object::typeinfo,&Schema_2x3::IfcExtrudedAreaSolid::typeinfo,
                         0xffffffffffffffff);
  if (solid != (IfcExtrudedAreaSolid *)0x0) {
    ProcessExtrudedAreaSolid
              (solid,meshout,conv,
               conv->collect_openings !=
               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)0x0);
    return;
  }
  solid_00 = (IfcRevolvedAreaSolid *)
             __dynamic_cast(p_Var4,&STEP::Object::typeinfo,
                            &Schema_2x3::IfcRevolvedAreaSolid::typeinfo,0xffffffffffffffff);
  if (solid_00 != (IfcRevolvedAreaSolid *)0x0) {
    ProcessRevolvedAreaSolid(solid_00,meshout,conv);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c0,
             *(char **)(&(swept->super_IfcSolidModel).super_IfcGeometricRepresentationItem.
                         super_IfcRepresentationItem.
                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                         field_0x10 + (long)pp_Var1[-3]),&local_1e1);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1c0,0,(char *)0x0,0x6dcbf6);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_1e0.field_2._M_allocated_capacity = *psVar3;
    local_1e0.field_2._8_8_ = plVar2[3];
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  }
  else {
    local_1e0.field_2._M_allocated_capacity = *psVar3;
    local_1e0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_1e0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
  basic_formatter<std::__cxx11::string>
            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a0,
             &local_1e0);
  LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_1a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  return;
}

Assistant:

void ProcessSweptAreaSolid(const Schema_2x3::IfcSweptAreaSolid& swept, TempMesh& meshout,
    ConversionData& conv)
{
    if(const Schema_2x3::IfcExtrudedAreaSolid* const solid = swept.ToPtr<Schema_2x3::IfcExtrudedAreaSolid>()) {
        ProcessExtrudedAreaSolid(*solid,meshout,conv, !!conv.collect_openings);
    }
    else if(const Schema_2x3::IfcRevolvedAreaSolid* const rev = swept.ToPtr<Schema_2x3::IfcRevolvedAreaSolid>()) {
        ProcessRevolvedAreaSolid(*rev,meshout,conv);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcSweptAreaSolid entity, type is " + swept.GetClassName());
    }
}